

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexec_run.c
# Opt level: O1

void pathexec_run(char *file,char **argv,char **envp)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  char *s;
  int local_34;
  
  uVar1 = str_chr(file,0x2f);
  if (file[uVar1] != '\0') {
    execve(file,argv,envp);
    return;
  }
  pcVar3 = env_get("PATH");
  s = "/bin:/usr/bin";
  if (pcVar3 != (char *)0x0) {
    s = pcVar3;
  }
  uVar1 = str_chr(s,0x3a);
  iVar2 = stralloc_copyb(&tmp,s,uVar1);
  if (iVar2 != 0) {
    local_34 = 0;
    do {
      if ((uVar1 == 0) && (iVar2 = stralloc_cats(&tmp,"."), iVar2 == 0)) {
        return;
      }
      iVar2 = stralloc_cats(&tmp,"/");
      if (iVar2 == 0) {
        return;
      }
      iVar2 = stralloc_cats(&tmp,file);
      if (iVar2 == 0) {
        return;
      }
      iVar2 = stralloc_append(&tmp,"");
      if (iVar2 == 0) {
        return;
      }
      execve(tmp.s,argv,envp);
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if ((((iVar2 != error_noent) && (local_34 = iVar2, iVar2 != error_acces)) &&
          (iVar2 != error_perm)) && (iVar2 != error_isdir)) {
        return;
      }
      if (s[uVar1] == '\0') {
        if (local_34 == 0) {
          return;
        }
        *piVar4 = local_34;
        return;
      }
      s = s + (ulong)uVar1 + 1;
      uVar1 = str_chr(s,0x3a);
      iVar2 = stralloc_copyb(&tmp,s,uVar1);
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void pathexec_run(const char *file,const char * const *argv,const char * const *envp)
{
  const char *path;
  unsigned int split;
  int savederrno;

  if (file[str_chr(file,'/')]) {
    execve(file,(char *const*)argv,(char *const*)envp);
    return;
  }

  path = env_get("PATH");
  if (!path) path = "/bin:/usr/bin";

  savederrno = 0;
  for (;;) {
    split = str_chr(path,':');
    if (!stralloc_copyb(&tmp,path,split)) return;
    if (!split)
      if (!stralloc_cats(&tmp,".")) return;
    if (!stralloc_cats(&tmp,"/"))  return;
    if (!stralloc_cats(&tmp,file)) return;
    if (!stralloc_0(&tmp)) return;

    execve(tmp.s,(char *const*)argv,(char*const*)envp);
    if (errno != error_noent) {
      savederrno = errno;
      if ((errno != error_acces) && (errno != error_perm) && (errno != error_isdir)) return;
    }

    if (!path[split]) {
      if (savederrno) errno = savederrno;
      return;
    }
    path += split;
    path += 1;
  }
}